

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void FFSMarshalInstallPreciousMetadata(SstStream Stream,TSMetadataMsg MetaData)

{
  SstData p_Var1;
  undefined8 *puVar2;
  SstStream p_Var3;
  TSMetadataMsg p_Var4;
  int iVar5;
  undefined8 uVar6;
  FFSContext p_Var7;
  void *pvVar8;
  void *__dest;
  undefined8 uVar9;
  size_t sVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  FFSFormatList Entry;
  FFSFormatList pFVar14;
  int Type;
  int ElementSize;
  void *local_60;
  SstStream local_58;
  int local_4c;
  long local_48;
  TSMetadataMsg local_40;
  undefined1 local_34 [4];
  
  if (Stream->ReaderFFSContext == (FFSContext)0x0) {
    uVar6 = create_local_FMcontext();
    p_Var7 = (FFSContext)create_FFSContext_FM(uVar6);
    Stream->ReaderFFSContext = p_Var7;
    free_FMcontext(uVar6);
  }
  local_40 = MetaData;
  for (pFVar14 = MetaData->Formats; pFVar14 != (FFSFormatList)0x0; pFVar14 = pFVar14->Next) {
    sVar10 = pFVar14->FormatIDRepLen;
    pvVar8 = malloc(sVar10);
    __dest = malloc(pFVar14->FormatServerRepLen);
    memcpy(pvVar8,pFVar14->FormatIDRep,sVar10);
    memcpy(__dest,pFVar14->FormatServerRep,pFVar14->FormatServerRepLen);
    uVar6 = FMContext_from_FFS(Stream->ReaderFFSContext);
    load_external_format_FMcontext(uVar6,pvVar8,(int)pFVar14->FormatIDRepLen);
    free(pvVar8);
  }
  (*Stream->AttrSetupUpcall)(Stream->SetupUpcallReader,(char *)0x0,0,(void *)0x0);
  if (0 < Stream->WriterCohortSize) {
    lVar12 = 0;
    local_58 = Stream;
    do {
      p_Var4 = local_40;
      p_Var3 = local_58;
      if (local_40->AttributeData[lVar12].DataSize == 0) {
        return;
      }
      local_48 = lVar12;
      uVar6 = FFSTypeHandle_from_encode
                        (local_58->ReaderFFSContext,local_40->AttributeData[lVar12].block);
      iVar5 = FFShas_conversion(uVar6);
      if (iVar5 == 0) {
        uVar9 = FMContext_from_FFS(p_Var3->ReaderFFSContext);
        uVar9 = FMformat_from_ID(uVar9,p_Var4->AttributeData[lVar12].block);
        uVar9 = format_list_of_FMFormat(uVar9);
        uVar9 = FMcopy_struct_list(uVar9);
        FMlocalize_structs(uVar9);
        establish_conversion(p_Var3->ReaderFFSContext,uVar6,uVar9);
        FMfree_struct_list(uVar9);
      }
      iVar5 = FFSdecode_in_place_possible(uVar6);
      p_Var1 = p_Var4->AttributeData;
      if (iVar5 == 0) {
        sVar10 = FFS_est_decode_length
                           (p_Var3->ReaderFFSContext,p_Var1[lVar12].block,p_Var1[lVar12].DataSize);
        local_60 = malloc(sVar10);
        uVar9 = create_fixed_FFSBuffer(local_60,sVar10);
        FFSdecode_to_buffer(p_Var3->ReaderFFSContext,p_Var4->AttributeData[lVar12].block,uVar9);
      }
      else {
        FFSdecode_in_place(p_Var3->ReaderFFSContext,p_Var1[lVar12].block,&local_60);
      }
      if (LoadAttributes_DumpMetadata == 0xffffffff) {
        pcVar11 = getenv("SstDumpMetadata");
        LoadAttributes_DumpMetadata = (uint)(pcVar11 != (char *)0x0);
      }
      if ((LoadAttributes_DumpMetadata != 0) && (local_58->Rank == 0)) {
        printf("\nIncomingAttributeDatablock from WriterRank %d is %p :\n",local_48,local_60);
        uVar9 = FMFormat_of_original(uVar6);
        FMdump_data(uVar9,local_60,0xfa000);
        puts("\n");
      }
      uVar6 = FMFormat_of_original(uVar6);
      lVar12 = format_list_of_FMFormat(uVar6);
      p_Var3 = local_58;
      pcVar11 = (char *)**(undefined8 **)(lVar12 + 8);
      puVar2 = *(undefined8 **)(lVar12 + 8);
      while (pcVar11 != (char *)0x0) {
        pvVar8 = (void *)((long)*(int *)((long)puVar2 + 0x14) + (long)local_60);
        pcVar13 = strchr(pcVar11,0x5f);
        pcVar13 = strchr(pcVar13 + 1,0x5f);
        __isoc99_sscanf(pcVar11,"SST%d_%d_",local_34,&local_4c);
        iVar5 = local_4c;
        pcVar11 = strdup(pcVar13 + 1);
        (*p_Var3->AttrSetupUpcall)(p_Var3->SetupUpcallReader,pcVar11,iVar5,pvVar8);
        free(pcVar11);
        pcVar11 = (char *)puVar2[3];
        puVar2 = puVar2 + 3;
      }
      lVar12 = local_48 + 1;
    } while (lVar12 < p_Var3->WriterCohortSize);
  }
  return;
}

Assistant:

extern void FFSMarshalInstallPreciousMetadata(SstStream Stream, TSMetadataMsg MetaData)
{
    if (!Stream->ReaderFFSContext)
    {
        FMContext Tmp = create_local_FMcontext();
        Stream->ReaderFFSContext = create_FFSContext_FM(Tmp);
        free_FMcontext(Tmp);
    }

    LoadFormats(Stream, MetaData->Formats);

    LoadAttributes(Stream, MetaData);
}